

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O2

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_atom<char_const*>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,
          regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          *this,char **begin,char *end)

{
  compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
  *this_00;
  char *pcVar1;
  byte *pbVar2;
  compiler_token_type cVar3;
  syntax_option_type flags;
  assert_eos_matcher *matcher;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *in_R8;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *in_R9;
  bool bVar4;
  escape_value eVar5;
  regex_error rStack_88;
  source_location local_48;
  
  pcVar1 = *begin;
  this_00 = (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
             *)(this + 0x10);
  cVar3 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          ::get_token<char_const*>(this_00,begin,end);
  flags = (syntax_option_type)this_00;
  switch(cVar3) {
  case token_literal:
    parse_literal<char_const*>((string_type *)&rStack_88,this,begin,end);
    detail::
    make_literal_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)&rStack_88,
               (string_type *)(ulong)*(uint *)(this + 0x220),flags,in_R8);
    goto LAB_00121c5b;
  case token_any:
    detail::
    make_any_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)(ulong)*(uint *)(this + 0x220),flags,
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
               &switchD_00121b3c::switchdataD_00155118);
    break;
  case token_escape:
    eVar5 = parse_escape<char_const*>(this,begin,end);
    if (eVar5._8_8_ >> 0x20 == 0) {
      detail::
      make_char_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                (__return_storage_ptr__,(detail *)(ulong)(uint)(int)eVar5.ch_,
                 (char)*(undefined4 *)(this + 0x220),flags,in_R8);
      return __return_storage_ptr__;
    }
    if (eVar5.type_ == escape_class) {
      pbVar2 = (byte *)*begin;
      *begin = (char *)(pbVar2 + 1);
      if (*(ushort *)(this + 0x228) == 0) {
        bVar4 = false;
      }
      else {
        bVar4 = (*(ushort *)(this_00 + (ulong)*pbVar2 * 2) & *(ushort *)(this + 0x228)) != 0;
      }
      detail::
      make_posix_charset_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                (__return_storage_ptr__,(detail *)(ulong)eVar5.class_,(ushort)bVar4,
                 SUB41(*(undefined4 *)(this + 0x220),0),flags,in_R9);
      return __return_storage_ptr__;
    }
    if (eVar5.type_ == escape_mark) {
      detail::
      make_backref_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                (__return_storage_ptr__,(detail *)(ulong)(uint)eVar5.mark_nbr_,
                 *(int *)(this + 0x220),flags,in_R8);
      return __return_storage_ptr__;
    }
  case token_group_begin:
    parse_group<char_const*>(__return_storage_ptr__,this,begin,end);
    break;
  case token_group_end:
  case token_alternate:
  case token_charset_end:
  case token_charset_invert:
  case token_charset_hyphen:
  case token_charset_backspace:
  case token_posix_charset_begin:
  case token_posix_charset_end:
  case token_equivalence_class_begin:
  case token_equivalence_class_end:
  case token_collation_element_begin:
  case token_collation_element_end:
  case token_no_mark:
  case token_positive_lookahead:
  case token_negative_lookahead:
  case token_positive_lookbehind:
  case token_negative_lookbehind:
  case token_independent_sub_expression:
  case token_comment:
  case token_recurse:
  case token_rule_assign:
  case token_rule_ref:
  case token_named_mark:
  case token_named_mark_ref:
switchD_00121b3c_caseD_4:
    *begin = pcVar1;
    goto LAB_00121b75;
  case token_invalid_quantifier:
    regex_error::regex_error(&rStack_88,error_badrepeat,"quantifier not expected");
    local_48.file_ =
         "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
    ;
    local_48.function_ =
         "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_atom(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
    ;
    local_48.line_ = 0x231;
    local_48.column_ = 0;
    throw_exception<boost::xpressive::regex_error>(&rStack_88,&local_48);
  case token_charset_begin:
    parse_charset<char_const*>(__return_storage_ptr__,this,begin,end);
    break;
  case token_quote_meta_begin:
    parse_quote_meta<char_const*>((string_type *)&rStack_88,this,begin,end);
    detail::
    make_literal_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)&rStack_88,
               (string_type *)(ulong)*(uint *)(this + 0x220),flags,in_R8);
LAB_00121c5b:
    std::__cxx11::string::~string((string *)&rStack_88);
    break;
  case token_quote_meta_end:
    regex_error::regex_error
              (&rStack_88,error_escape,"found quote-meta end without corresponding quote-meta begin"
              );
    local_48.file_ =
         "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
    ;
    local_48.function_ =
         "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_atom(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
    ;
    local_48.line_ = 0x240;
    local_48.column_ = 0;
    throw_exception<boost::xpressive::regex_error>(&rStack_88,&local_48);
  case token_assert_begin_sequence:
    detail::
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::assert_bos_matcher>
              (__return_storage_ptr__,(detail *)&rStack_88,(assert_bos_matcher *)matcher);
    break;
  case token_assert_end_sequence:
    detail::
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::assert_eos_matcher>
              (__return_storage_ptr__,(detail *)&rStack_88,matcher);
    break;
  case token_assert_begin_line:
    detail::
    make_assert_begin_line<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)(ulong)*(uint *)(this + 0x220),flags,
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
               &switchD_00121b3c::switchdataD_00155118);
    break;
  case token_assert_end_line:
    detail::
    make_assert_end_line<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)(ulong)*(uint *)(this + 0x220),flags,
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
               &switchD_00121b3c::switchdataD_00155118);
    break;
  case token_assert_word_begin:
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_begin,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)this_00);
    break;
  case token_assert_word_end:
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_end,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)this_00);
    break;
  case token_assert_word_boundary:
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_boundary<mpl_::bool_<true>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)this_00);
    break;
  case token_assert_not_word_boundary:
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_boundary<mpl_::bool_<false>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)this_00);
    break;
  default:
    if (cVar3 != token_end_of_pattern) goto switchD_00121b3c_caseD_4;
LAB_00121b75:
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::sequence(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

detail::sequence<BidiIter> parse_atom(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        escape_value esc = { 0, 0, 0, detail::escape_char };
        FwdIter old_begin = begin;

        switch(this->traits_.get_token(begin, end))
        {
        case token_literal:
            return detail::make_literal_xpression<BidiIter>
            (
                this->parse_literal(begin, end), this->traits_.flags(), this->rxtraits()
            );

        case token_any:
            return detail::make_any_xpression<BidiIter>(this->traits_.flags(), this->rxtraits());

        case token_assert_begin_sequence:
            return detail::make_dynamic<BidiIter>(detail::assert_bos_matcher());

        case token_assert_end_sequence:
            return detail::make_dynamic<BidiIter>(detail::assert_eos_matcher());

        case token_assert_begin_line:
            return detail::make_assert_begin_line<BidiIter>(this->traits_.flags(), this->rxtraits());

        case token_assert_end_line:
            return detail::make_assert_end_line<BidiIter>(this->traits_.flags(), this->rxtraits());

        case token_assert_word_boundary:
            return detail::make_assert_word<BidiIter>(detail::word_boundary<mpl::true_>(), this->rxtraits());

        case token_assert_not_word_boundary:
            return detail::make_assert_word<BidiIter>(detail::word_boundary<mpl::false_>(), this->rxtraits());

        case token_assert_word_begin:
            return detail::make_assert_word<BidiIter>(detail::word_begin(), this->rxtraits());

        case token_assert_word_end:
            return detail::make_assert_word<BidiIter>(detail::word_end(), this->rxtraits());

        case token_escape:
            esc = this->parse_escape(begin, end);
            switch(esc.type_)
            {
            case detail::escape_mark:
                return detail::make_backref_xpression<BidiIter>
                (
                    esc.mark_nbr_, this->traits_.flags(), this->rxtraits()
                );
            case detail::escape_char:
                return detail::make_char_xpression<BidiIter>
                (
                    esc.ch_, this->traits_.flags(), this->rxtraits()
                );
            case detail::escape_class:
                return detail::make_posix_charset_xpression<BidiIter>
                (
                    esc.class_
                  , this->is_upper_(*begin++)
                  , this->traits_.flags()
                  , this->rxtraits()
                );
            }

        case token_group_begin:
            return this->parse_group(begin, end);

        case token_charset_begin:
            return this->parse_charset(begin, end);

        case token_invalid_quantifier:
            BOOST_THROW_EXCEPTION(regex_error(error_badrepeat, "quantifier not expected"));
            break;

        case token_quote_meta_begin:
            return detail::make_literal_xpression<BidiIter>
            (
                this->parse_quote_meta(begin, end), this->traits_.flags(), this->rxtraits()
            );

        case token_quote_meta_end:
            BOOST_THROW_EXCEPTION(
                regex_error(
                    error_escape
                  , "found quote-meta end without corresponding quote-meta begin"
                )
            );
            break;

        case token_end_of_pattern:
            break;

        default:
            begin = old_begin;
            break;
        }

        return detail::sequence<BidiIter>();
    }